

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16781328,_false,_embree::sse42::VirtualCurveIntersectorK<4>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  undefined8 uVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 (*pauVar16) [16];
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 (*pauVar20) [16];
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  float fVar38;
  float fVar39;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar40;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  vint4 bi;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  float fVar50;
  float fVar57;
  float fVar59;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar58;
  float fVar60;
  float fVar61;
  float fVar62;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar70;
  float fVar71;
  vint4 ai_3;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar72;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  vint4 bi_1;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  vint4 ai;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  vint4 ai_1;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar98 [16];
  int iVar99;
  float fVar100;
  int iVar101;
  float fVar102;
  int iVar103;
  float fVar104;
  int iVar105;
  float fVar106;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_10c8 [16];
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  Intersectors *local_1090;
  Precalculations *local_1088;
  RayHitK<4> *local_1080;
  int local_1078;
  int iStack_1074;
  int iStack_1070;
  int iStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  size_t local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_1088 = pre;
  local_1090 = This;
  pauVar20 = (undefined1 (*) [16])local_f68;
  local_f78 = root.ptr;
  uStack_f70 = 0;
  fVar88 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar89 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar90 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_fe8 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fStack_fe4 = local_fe8;
  fStack_fe0 = local_fe8;
  fStack_fdc = local_fe8;
  local_ff8 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fStack_ff4 = local_ff8;
  fStack_ff0 = local_ff8;
  fStack_fec = local_ff8;
  local_1008 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fStack_1004 = local_1008;
  fStack_1000 = local_1008;
  fStack_ffc = local_1008;
  fVar91 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar70 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar38 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar99 = (tray->tnear).field_0.i[k];
  iVar41 = (tray->tfar).field_0.i[k];
  local_1038 = fVar88;
  fStack_1034 = fVar88;
  fStack_1030 = fVar88;
  fStack_102c = fVar88;
  local_10b8 = fVar89;
  fStack_10b4 = fVar89;
  fStack_10b0 = fVar89;
  fStack_10ac = fVar89;
  local_10a8 = fVar90;
  fStack_10a4 = fVar90;
  fStack_10a0 = fVar90;
  fStack_109c = fVar90;
  local_1048 = fVar91;
  fStack_1044 = fVar91;
  fStack_1040 = fVar91;
  fStack_103c = fVar91;
  local_1058 = fVar70;
  fStack_1054 = fVar70;
  fStack_1050 = fVar70;
  fStack_104c = fVar70;
  local_1068 = fVar38;
  fStack_1064 = fVar38;
  fStack_1060 = fVar38;
  fStack_105c = fVar38;
  local_1078 = iVar99;
  iStack_1074 = iVar99;
  iStack_1070 = iVar99;
  iStack_106c = iVar99;
  local_1080 = ray;
  iVar42 = iVar41;
  iVar43 = iVar41;
  iVar44 = iVar41;
  fVar96 = fVar91;
  fVar71 = fVar91;
  fVar39 = fVar91;
  fVar97 = fVar70;
  fVar72 = fVar70;
  fVar40 = fVar70;
  fVar49 = fVar38;
  fVar50 = fVar38;
  fVar57 = fVar38;
  fVar58 = fVar88;
  fVar59 = fVar88;
  fVar60 = fVar88;
  fVar61 = fVar89;
  fVar62 = fVar89;
  fVar83 = fVar89;
  fVar84 = fVar90;
  fVar85 = fVar90;
  fVar86 = fVar90;
  iVar101 = iVar99;
  iVar103 = iVar99;
  iVar105 = iVar99;
  do {
    pauVar16 = pauVar20 + -1;
    pauVar20 = pauVar20 + -1;
    if (*(float *)((long)*pauVar16 + 8) < *(float *)(ray + k * 4 + 0x80) ||
        *(float *)((long)*pauVar16 + 8) == *(float *)(ray + k * 4 + 0x80)) {
      uVar24 = *(ulong *)*pauVar20;
      while ((uVar24 & 8) == 0) {
        fVar5 = *(float *)(ray + k * 4 + 0x70);
        uVar22 = (uint)uVar24 & 7;
        uVar21 = uVar24 & 0xfffffffffffffff0;
        if (uVar22 == 3) {
          local_fa8 = *(float *)(uVar21 + 0x20);
          fStack_fa4 = *(float *)(uVar21 + 0x24);
          fStack_fa0 = *(float *)(uVar21 + 0x28);
          fStack_f9c = *(float *)(uVar21 + 0x2c);
          local_fb8 = *(float *)(uVar21 + 0x30);
          fStack_fb4 = *(float *)(uVar21 + 0x34);
          fStack_fb0 = *(float *)(uVar21 + 0x38);
          fStack_fac = *(float *)(uVar21 + 0x3c);
          local_fd8 = *(float *)(uVar21 + 0x50);
          fStack_fd4 = *(float *)(uVar21 + 0x54);
          fStack_fd0 = *(float *)(uVar21 + 0x58);
          fStack_fcc = *(float *)(uVar21 + 0x5c);
          local_fc8 = *(float *)(uVar21 + 0x60);
          fStack_fc4 = *(float *)(uVar21 + 100);
          fStack_fc0 = *(float *)(uVar21 + 0x68);
          fStack_fbc = *(float *)(uVar21 + 0x6c);
          local_1018 = *(undefined8 *)(uVar21 + 0x70);
          uStack_1010 = *(undefined8 *)(uVar21 + 0x78);
          uVar18 = local_1018;
          uVar19 = uStack_1010;
          local_1028 = *(undefined8 *)(uVar21 + 0xa0);
          uStack_1020 = *(undefined8 *)(uVar21 + 0xa8);
          uVar10 = local_1028;
          uVar17 = uStack_1020;
          fVar83 = 1.0 - fVar5;
          fVar84 = fVar83 * 0.0;
          local_f98 = *(float *)(uVar21 + 0xe0) * fVar5 + fVar84;
          fStack_f94 = *(float *)(uVar21 + 0xe4) * fVar5 + fVar84;
          fStack_f90 = *(float *)(uVar21 + 0xe8) * fVar5 + fVar84;
          fStack_f8c = *(float *)(uVar21 + 0xec) * fVar5 + fVar84;
          local_f88 = *(float *)(uVar21 + 0xf0) * fVar5 + fVar84;
          fStack_f84 = *(float *)(uVar21 + 0xf4) * fVar5 + fVar84;
          fStack_f80 = *(float *)(uVar21 + 0xf8) * fVar5 + fVar84;
          fStack_f7c = *(float *)(uVar21 + 0xfc) * fVar5 + fVar84;
          auVar67._0_4_ =
               local_fe8 * local_fa8 +
               local_ff8 * local_fd8 + local_1008 * *(float *)(uVar21 + 0x80);
          auVar67._4_4_ =
               fStack_fe4 * fStack_fa4 +
               fStack_ff4 * fStack_fd4 + fStack_1004 * *(float *)(uVar21 + 0x84);
          auVar67._8_4_ =
               fStack_fe0 * fStack_fa0 +
               fStack_ff0 * fStack_fd0 + fStack_1000 * *(float *)(uVar21 + 0x88);
          auVar67._12_4_ =
               fStack_fdc * fStack_f9c +
               fStack_fec * fStack_fcc + fStack_ffc * *(float *)(uVar21 + 0x8c);
          auVar74._0_4_ =
               local_fe8 * local_fb8 +
               local_ff8 * local_fc8 + local_1008 * *(float *)(uVar21 + 0x90);
          auVar74._4_4_ =
               fStack_fe4 * fStack_fb4 +
               fStack_ff4 * fStack_fc4 + fStack_1004 * *(float *)(uVar21 + 0x94);
          auVar74._8_4_ =
               fStack_fe0 * fStack_fb0 +
               fStack_ff0 * fStack_fc0 + fStack_1000 * *(float *)(uVar21 + 0x98);
          auVar74._12_4_ =
               fStack_fdc * fStack_fac +
               fStack_fec * fStack_fbc + fStack_ffc * *(float *)(uVar21 + 0x9c);
          fVar88 = (float)DAT_01f80d30;
          fVar89 = DAT_01f80d30._4_4_;
          fVar90 = DAT_01f80d30._8_4_;
          fVar91 = DAT_01f80d30._12_4_;
          auVar66._4_4_ = -(uint)(ABS(auVar67._4_4_) < fVar89);
          auVar66._0_4_ = -(uint)(ABS(auVar67._0_4_) < fVar88);
          auVar66._8_4_ = -(uint)(ABS(auVar67._8_4_) < fVar90);
          auVar66._12_4_ = -(uint)(ABS(auVar67._12_4_) < fVar91);
          auVar82 = blendvps(auVar67,_DAT_01f80d30,auVar66);
          auVar79._4_4_ = -(uint)(ABS(auVar74._4_4_) < fVar89);
          auVar79._0_4_ = -(uint)(ABS(auVar74._0_4_) < fVar88);
          auVar79._8_4_ = -(uint)(ABS(auVar74._8_4_) < fVar90);
          auVar79._12_4_ = -(uint)(ABS(auVar74._12_4_) < fVar91);
          auVar79 = blendvps(auVar74,_DAT_01f80d30,auVar79);
          local_1028._4_4_ = (float)((ulong)local_1028 >> 0x20);
          uStack_1020._4_4_ = (float)((ulong)uStack_1020 >> 0x20);
          local_1018._4_4_ = (float)((ulong)local_1018 >> 0x20);
          uStack_1010._4_4_ = (float)((ulong)uStack_1010 >> 0x20);
          auVar53._0_4_ =
               local_fe8 * *(float *)(uVar21 + 0x40) +
               local_ff8 * (float)local_1018 + local_1008 * (float)local_1028;
          auVar53._4_4_ =
               fStack_fe4 * *(float *)(uVar21 + 0x44) +
               fStack_ff4 * local_1018._4_4_ + fStack_1004 * local_1028._4_4_;
          auVar53._8_4_ =
               fStack_fe0 * *(float *)(uVar21 + 0x48) +
               fStack_ff0 * (float)uStack_1010 + fStack_1000 * (float)uStack_1020;
          auVar53._12_4_ =
               fStack_fdc * *(float *)(uVar21 + 0x4c) +
               fStack_fec * uStack_1010._4_4_ + fStack_ffc * uStack_1020._4_4_;
          auVar77._4_4_ = -(uint)(ABS(auVar53._4_4_) < fVar89);
          auVar77._0_4_ = -(uint)(ABS(auVar53._0_4_) < fVar88);
          auVar77._8_4_ = -(uint)(ABS(auVar53._8_4_) < fVar90);
          auVar77._12_4_ = -(uint)(ABS(auVar53._12_4_) < fVar91);
          auVar66 = blendvps(auVar53,_DAT_01f80d30,auVar77);
          auVar52 = rcpps(auVar77,auVar82);
          fVar88 = auVar52._0_4_;
          fVar91 = auVar52._4_4_;
          fVar96 = auVar52._8_4_;
          fVar97 = auVar52._12_4_;
          fVar88 = (1.0 - auVar82._0_4_ * fVar88) * fVar88 + fVar88;
          fVar91 = (1.0 - auVar82._4_4_ * fVar91) * fVar91 + fVar91;
          fVar96 = (1.0 - auVar82._8_4_ * fVar96) * fVar96 + fVar96;
          fVar97 = (1.0 - auVar82._12_4_ * fVar97) * fVar97 + fVar97;
          auVar52 = rcpps(auVar52,auVar79);
          fVar89 = auVar52._0_4_;
          auVar75._0_4_ = auVar79._0_4_ * fVar89;
          fVar70 = auVar52._4_4_;
          auVar75._4_4_ = auVar79._4_4_ * fVar70;
          fVar71 = auVar52._8_4_;
          auVar75._8_4_ = auVar79._8_4_ * fVar71;
          fVar72 = auVar52._12_4_;
          auVar75._12_4_ = auVar79._12_4_ * fVar72;
          fVar89 = (1.0 - auVar75._0_4_) * fVar89 + fVar89;
          fVar70 = (1.0 - auVar75._4_4_) * fVar70 + fVar70;
          fVar71 = (1.0 - auVar75._8_4_) * fVar71 + fVar71;
          fVar72 = (1.0 - auVar75._12_4_) * fVar72 + fVar72;
          auVar52 = rcpps(auVar75,auVar66);
          fVar90 = auVar52._0_4_;
          fVar38 = auVar52._4_4_;
          fVar39 = auVar52._8_4_;
          fVar40 = auVar52._12_4_;
          fVar90 = (1.0 - auVar66._0_4_ * fVar90) * fVar90 + fVar90;
          fVar38 = (1.0 - auVar66._4_4_ * fVar38) * fVar38 + fVar38;
          fVar39 = (1.0 - auVar66._8_4_ * fVar39) * fVar39 + fVar39;
          fVar40 = (1.0 - auVar66._12_4_ * fVar40) * fVar40 + fVar40;
          fVar49 = local_fa8 * local_1038 +
                   local_fd8 * local_10b8 +
                   *(float *)(uVar21 + 0x80) * local_10a8 + *(float *)(uVar21 + 0xb0);
          fVar57 = fStack_fa4 * fStack_1034 +
                   fStack_fd4 * fStack_10b4 +
                   *(float *)(uVar21 + 0x84) * fStack_10a4 + *(float *)(uVar21 + 0xb4);
          fVar59 = fStack_fa0 * fStack_1030 +
                   fStack_fd0 * fStack_10b0 +
                   *(float *)(uVar21 + 0x88) * fStack_10a0 + *(float *)(uVar21 + 0xb8);
          fVar61 = fStack_f9c * fStack_102c +
                   fStack_fcc * fStack_10ac +
                   *(float *)(uVar21 + 0x8c) * fStack_109c + *(float *)(uVar21 + 0xbc);
          fVar50 = local_fb8 * local_1038 +
                   local_fc8 * local_10b8 +
                   *(float *)(uVar21 + 0x90) * local_10a8 + *(float *)(uVar21 + 0xc0);
          fVar58 = fStack_fb4 * fStack_1034 +
                   fStack_fc4 * fStack_10b4 +
                   *(float *)(uVar21 + 0x94) * fStack_10a4 + *(float *)(uVar21 + 0xc4);
          fVar60 = fStack_fb0 * fStack_1030 +
                   fStack_fc0 * fStack_10b0 +
                   *(float *)(uVar21 + 0x98) * fStack_10a0 + *(float *)(uVar21 + 200);
          fVar62 = fStack_fac * fStack_102c +
                   fStack_fbc * fStack_10ac +
                   *(float *)(uVar21 + 0x9c) * fStack_109c + *(float *)(uVar21 + 0xcc);
          fVar100 = *(float *)(uVar21 + 0x40) * local_1038 +
                    (float)local_1018 * local_10b8 +
                    (float)local_1028 * local_10a8 + *(float *)(uVar21 + 0xd0);
          fVar102 = *(float *)(uVar21 + 0x44) * fStack_1034 +
                    local_1018._4_4_ * fStack_10b4 +
                    local_1028._4_4_ * fStack_10a4 + *(float *)(uVar21 + 0xd4);
          fVar104 = *(float *)(uVar21 + 0x48) * fStack_1030 +
                    (float)uStack_1010 * fStack_10b0 +
                    (float)uStack_1020 * fStack_10a0 + *(float *)(uVar21 + 0xd8);
          fVar106 = *(float *)(uVar21 + 0x4c) * fStack_102c +
                    uStack_1010._4_4_ * fStack_10ac +
                    uStack_1020._4_4_ * fStack_109c + *(float *)(uVar21 + 0xdc);
          auVar52._4_4_ = iStack_1074;
          auVar52._0_4_ = local_1078;
          auVar52._8_4_ = iStack_1070;
          auVar52._12_4_ = iStack_106c;
          fVar92 = (local_f98 - fVar49) * fVar88;
          fVar93 = (fStack_f94 - fVar57) * fVar91;
          fVar94 = (fStack_f90 - fVar59) * fVar96;
          fVar95 = (fStack_f8c - fVar61) * fVar97;
          fVar88 = ((*(float *)(uVar21 + 0x110) * fVar5 + fVar83) - fVar49) * fVar88;
          fVar91 = ((*(float *)(uVar21 + 0x114) * fVar5 + fVar83) - fVar57) * fVar91;
          fVar96 = ((*(float *)(uVar21 + 0x118) * fVar5 + fVar83) - fVar59) * fVar96;
          fVar97 = ((*(float *)(uVar21 + 0x11c) * fVar5 + fVar83) - fVar61) * fVar97;
          fVar49 = (local_f88 - fVar50) * fVar89;
          fVar57 = (fStack_f84 - fVar58) * fVar70;
          fVar59 = (fStack_f80 - fVar60) * fVar71;
          fVar61 = (fStack_f7c - fVar62) * fVar72;
          fVar85 = ((fVar84 + *(float *)(uVar21 + 0x100) * fVar5) - fVar100) * fVar90;
          fVar86 = ((fVar84 + *(float *)(uVar21 + 0x104) * fVar5) - fVar102) * fVar38;
          fVar87 = ((fVar84 + *(float *)(uVar21 + 0x108) * fVar5) - fVar104) * fVar39;
          fVar84 = ((fVar84 + *(float *)(uVar21 + 0x10c) * fVar5) - fVar106) * fVar40;
          fVar89 = ((*(float *)(uVar21 + 0x120) * fVar5 + fVar83) - fVar50) * fVar89;
          fVar70 = ((*(float *)(uVar21 + 0x124) * fVar5 + fVar83) - fVar58) * fVar70;
          fVar71 = ((*(float *)(uVar21 + 0x128) * fVar5 + fVar83) - fVar60) * fVar71;
          fVar72 = ((*(float *)(uVar21 + 300) * fVar5 + fVar83) - fVar62) * fVar72;
          fVar90 = ((fVar5 * *(float *)(uVar21 + 0x130) + fVar83) - fVar100) * fVar90;
          fVar38 = ((fVar5 * *(float *)(uVar21 + 0x134) + fVar83) - fVar102) * fVar38;
          fVar39 = ((fVar5 * *(float *)(uVar21 + 0x138) + fVar83) - fVar104) * fVar39;
          fVar40 = ((fVar5 * *(float *)(uVar21 + 0x13c) + fVar83) - fVar106) * fVar40;
          auVar82._0_4_ =
               (uint)((int)fVar89 < (int)fVar49) * (int)fVar89 |
               (uint)((int)fVar89 >= (int)fVar49) * (int)fVar49;
          auVar82._4_4_ =
               (uint)((int)fVar70 < (int)fVar57) * (int)fVar70 |
               (uint)((int)fVar70 >= (int)fVar57) * (int)fVar57;
          auVar82._8_4_ =
               (uint)((int)fVar71 < (int)fVar59) * (int)fVar71 |
               (uint)((int)fVar71 >= (int)fVar59) * (int)fVar59;
          auVar82._12_4_ =
               (uint)((int)fVar72 < (int)fVar61) * (int)fVar72 |
               (uint)((int)fVar72 >= (int)fVar61) * (int)fVar61;
          auVar54._0_4_ =
               (uint)((int)fVar90 < (int)fVar85) * (int)fVar90 |
               (uint)((int)fVar90 >= (int)fVar85) * (int)fVar85;
          auVar54._4_4_ =
               (uint)((int)fVar38 < (int)fVar86) * (int)fVar38 |
               (uint)((int)fVar38 >= (int)fVar86) * (int)fVar86;
          auVar54._8_4_ =
               (uint)((int)fVar39 < (int)fVar87) * (int)fVar39 |
               (uint)((int)fVar39 >= (int)fVar87) * (int)fVar87;
          auVar54._12_4_ =
               (uint)((int)fVar40 < (int)fVar84) * (int)fVar40 |
               (uint)((int)fVar40 >= (int)fVar84) * (int)fVar84;
          auVar66 = maxps(auVar82,auVar54);
          auVar55._0_4_ =
               (uint)((int)fVar88 < (int)fVar92) * (int)fVar88 |
               (uint)((int)fVar88 >= (int)fVar92) * (int)fVar92;
          auVar55._4_4_ =
               (uint)((int)fVar91 < (int)fVar93) * (int)fVar91 |
               (uint)((int)fVar91 >= (int)fVar93) * (int)fVar93;
          auVar55._8_4_ =
               (uint)((int)fVar96 < (int)fVar94) * (int)fVar96 |
               (uint)((int)fVar96 >= (int)fVar94) * (int)fVar94;
          auVar55._12_4_ =
               (uint)((int)fVar97 < (int)fVar95) * (int)fVar97 |
               (uint)((int)fVar97 >= (int)fVar95) * (int)fVar95;
          auVar80._0_4_ =
               (uint)((int)fVar88 < (int)fVar92) * (int)fVar92 |
               (uint)((int)fVar88 >= (int)fVar92) * (int)fVar88;
          auVar80._4_4_ =
               (uint)((int)fVar91 < (int)fVar93) * (int)fVar93 |
               (uint)((int)fVar91 >= (int)fVar93) * (int)fVar91;
          auVar80._8_4_ =
               (uint)((int)fVar96 < (int)fVar94) * (int)fVar94 |
               (uint)((int)fVar96 >= (int)fVar94) * (int)fVar96;
          auVar80._12_4_ =
               (uint)((int)fVar97 < (int)fVar95) * (int)fVar95 |
               (uint)((int)fVar97 >= (int)fVar95) * (int)fVar97;
          auVar98._0_4_ =
               (uint)((int)fVar89 < (int)fVar49) * (int)fVar49 |
               (uint)((int)fVar89 >= (int)fVar49) * (int)fVar89;
          auVar98._4_4_ =
               (uint)((int)fVar70 < (int)fVar57) * (int)fVar57 |
               (uint)((int)fVar70 >= (int)fVar57) * (int)fVar70;
          auVar98._8_4_ =
               (uint)((int)fVar71 < (int)fVar59) * (int)fVar59 |
               (uint)((int)fVar71 >= (int)fVar59) * (int)fVar71;
          auVar98._12_4_ =
               (uint)((int)fVar72 < (int)fVar61) * (int)fVar61 |
               (uint)((int)fVar72 >= (int)fVar61) * (int)fVar72;
          auVar46._0_4_ =
               (uint)((int)fVar90 < (int)fVar85) * (int)fVar85 |
               (uint)((int)fVar90 >= (int)fVar85) * (int)fVar90;
          auVar46._4_4_ =
               (uint)((int)fVar38 < (int)fVar86) * (int)fVar86 |
               (uint)((int)fVar38 >= (int)fVar86) * (int)fVar38;
          auVar46._8_4_ =
               (uint)((int)fVar39 < (int)fVar87) * (int)fVar87 |
               (uint)((int)fVar39 >= (int)fVar87) * (int)fVar39;
          auVar46._12_4_ =
               (uint)((int)fVar40 < (int)fVar84) * (int)fVar84 |
               (uint)((int)fVar40 >= (int)fVar84) * (int)fVar40;
          auVar79 = minps(auVar98,auVar46);
          auVar52 = maxps(auVar52,auVar55);
          local_10c8 = maxps(auVar52,auVar66);
          auVar29._4_4_ = iVar42;
          auVar29._0_4_ = iVar41;
          auVar29._8_4_ = iVar43;
          auVar29._12_4_ = iVar44;
          auVar52 = minps(auVar29,auVar80);
          auVar52 = minps(auVar52,auVar79);
          auVar47._4_4_ = -(uint)(local_10c8._4_4_ <= auVar52._4_4_);
          auVar47._0_4_ = -(uint)(local_10c8._0_4_ <= auVar52._0_4_);
          auVar47._8_4_ = -(uint)(local_10c8._8_4_ <= auVar52._8_4_);
          auVar47._12_4_ = -(uint)(local_10c8._12_4_ <= auVar52._12_4_);
          uVar22 = movmskps(3,auVar47);
          fVar91 = local_1048;
          fVar96 = fStack_1044;
          fVar71 = fStack_1040;
          fVar39 = fStack_103c;
          fVar70 = local_1058;
          fVar97 = fStack_1054;
          fVar72 = fStack_1050;
          fVar40 = fStack_104c;
          fVar38 = local_1068;
          fVar49 = fStack_1064;
          fVar50 = fStack_1060;
          fVar57 = fStack_105c;
          fVar88 = local_1038;
          fVar58 = fStack_1034;
          fVar59 = fStack_1030;
          fVar60 = fStack_102c;
          fVar89 = local_10b8;
          fVar61 = fStack_10b4;
          fVar62 = fStack_10b0;
          fVar83 = fStack_10ac;
          fVar90 = local_10a8;
          fVar84 = fStack_10a4;
          fVar85 = fStack_10a0;
          fVar86 = fStack_109c;
          iVar99 = local_1078;
          iVar101 = iStack_1074;
          iVar103 = iStack_1070;
          iVar105 = iStack_106c;
          local_1028 = uVar10;
          uStack_1020 = uVar17;
          local_1018 = uVar18;
          uStack_1010 = uVar19;
        }
        else {
          pfVar3 = (float *)(uVar21 + 0x80 + uVar25);
          pfVar1 = (float *)(uVar21 + 0x20 + uVar25);
          pfVar4 = (float *)(uVar21 + 0x80 + uVar23);
          pfVar2 = (float *)(uVar21 + 0x20 + uVar23);
          auVar27._0_4_ = ((*pfVar3 * fVar5 + *pfVar1) - fVar88) * fVar91;
          auVar27._4_4_ = ((pfVar3[1] * fVar5 + pfVar1[1]) - fVar58) * fVar96;
          auVar27._8_4_ = ((pfVar3[2] * fVar5 + pfVar1[2]) - fVar59) * fVar71;
          auVar27._12_4_ = ((pfVar3[3] * fVar5 + pfVar1[3]) - fVar60) * fVar39;
          auVar51._0_4_ = ((*pfVar4 * fVar5 + *pfVar2) - fVar89) * fVar70;
          auVar51._4_4_ = ((pfVar4[1] * fVar5 + pfVar2[1]) - fVar61) * fVar97;
          auVar51._8_4_ = ((pfVar4[2] * fVar5 + pfVar2[2]) - fVar62) * fVar72;
          auVar51._12_4_ = ((pfVar4[3] * fVar5 + pfVar2[3]) - fVar83) * fVar40;
          pfVar2 = (float *)(uVar21 + 0x80 + uVar26);
          pfVar1 = (float *)(uVar21 + 0x20 + uVar26);
          auVar63._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar90) * fVar38;
          auVar63._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar84) * fVar49;
          auVar63._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar85) * fVar50;
          auVar63._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar86) * fVar57;
          auVar52 = maxps(auVar51,auVar63);
          pfVar2 = (float *)(uVar21 + 0x80 + (uVar25 ^ 0x10));
          pfVar1 = (float *)(uVar21 + 0x20 + (uVar25 ^ 0x10));
          auVar73._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar88) * fVar91;
          auVar73._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar58) * fVar96;
          auVar73._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar59) * fVar71;
          auVar73._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar60) * fVar39;
          pfVar2 = (float *)(uVar21 + 0x80 + (uVar23 ^ 0x10));
          pfVar1 = (float *)(uVar21 + 0x20 + (uVar23 ^ 0x10));
          auVar78._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar89) * fVar70;
          auVar78._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar61) * fVar97;
          auVar78._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar62) * fVar72;
          auVar78._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar83) * fVar40;
          pfVar2 = (float *)(uVar21 + 0x80 + (uVar26 ^ 0x10));
          pfVar1 = (float *)(uVar21 + 0x20 + (uVar26 ^ 0x10));
          auVar64._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar90) * fVar38;
          auVar64._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar84) * fVar49;
          auVar64._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar85) * fVar50;
          auVar64._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar86) * fVar57;
          auVar79 = minps(auVar78,auVar64);
          auVar65._4_4_ = iVar101;
          auVar65._0_4_ = iVar99;
          auVar65._8_4_ = iVar103;
          auVar65._12_4_ = iVar105;
          auVar66 = maxps(auVar65,auVar27);
          local_10c8 = maxps(auVar66,auVar52);
          auVar28._4_4_ = iVar42;
          auVar28._0_4_ = iVar41;
          auVar28._8_4_ = iVar43;
          auVar28._12_4_ = iVar44;
          auVar52 = minps(auVar28,auVar73);
          auVar52 = minps(auVar52,auVar79);
          if (uVar22 == 6) {
            bVar12 = (fVar5 < *(float *)(uVar21 + 0xf0) && *(float *)(uVar21 + 0xe0) <= fVar5) &&
                     local_10c8._0_4_ <= auVar52._0_4_;
            bVar13 = (fVar5 < *(float *)(uVar21 + 0xf4) && *(float *)(uVar21 + 0xe4) <= fVar5) &&
                     local_10c8._4_4_ <= auVar52._4_4_;
            bVar14 = (fVar5 < *(float *)(uVar21 + 0xf8) && *(float *)(uVar21 + 0xe8) <= fVar5) &&
                     local_10c8._8_4_ <= auVar52._8_4_;
            bVar15 = (fVar5 < *(float *)(uVar21 + 0xfc) && *(float *)(uVar21 + 0xec) <= fVar5) &&
                     local_10c8._12_4_ <= auVar52._12_4_;
          }
          else {
            bVar12 = local_10c8._0_4_ <= auVar52._0_4_;
            bVar13 = local_10c8._4_4_ <= auVar52._4_4_;
            bVar14 = local_10c8._8_4_ <= auVar52._8_4_;
            bVar15 = local_10c8._12_4_ <= auVar52._12_4_;
          }
          auVar45._0_4_ = (uint)bVar12 * -0x80000000;
          auVar45._4_4_ = (uint)bVar13 * -0x80000000;
          auVar45._8_4_ = (uint)bVar14 * -0x80000000;
          auVar45._12_4_ = (uint)bVar15 * -0x80000000;
          uVar22 = movmskps(uVar22,auVar45);
        }
        if (uVar22 == 0) goto LAB_00286a06;
        lVar11 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
          }
        }
        uVar24 = *(ulong *)(uVar21 + lVar11 * 8);
        uVar22 = uVar22 - 1 & uVar22;
        if (uVar22 != 0) {
          uVar6 = *(uint *)(local_10c8 + lVar11 * 4);
          lVar11 = 0;
          if (uVar22 != 0) {
            for (; (uVar22 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
            }
          }
          uVar9 = *(ulong *)(uVar21 + lVar11 * 8);
          uVar7 = *(uint *)(local_10c8 + lVar11 * 4);
          uVar22 = uVar22 - 1 & uVar22;
          if (uVar22 == 0) {
            if (uVar6 < uVar7) {
              *(ulong *)*pauVar20 = uVar9;
              *(uint *)((long)*pauVar20 + 8) = uVar7;
              pauVar20 = pauVar20 + 1;
            }
            else {
              *(ulong *)*pauVar20 = uVar24;
              *(uint *)((long)*pauVar20 + 8) = uVar6;
              pauVar20 = pauVar20 + 1;
              uVar24 = uVar9;
            }
          }
          else {
            auVar48._8_4_ = uVar6;
            auVar48._0_8_ = uVar24;
            auVar48._12_4_ = 0;
            auVar68._8_4_ = uVar7;
            auVar68._0_8_ = uVar9;
            auVar68._12_4_ = 0;
            lVar11 = 0;
            if (uVar22 != 0) {
              for (; (uVar22 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
              }
            }
            uVar10 = *(undefined8 *)(uVar21 + lVar11 * 8);
            iVar8 = *(int *)(local_10c8 + lVar11 * 4);
            auVar56._8_4_ = iVar8;
            auVar56._0_8_ = uVar10;
            auVar56._12_4_ = 0;
            auVar30._8_4_ = -(uint)((int)uVar6 < (int)uVar7);
            uVar22 = uVar22 - 1 & uVar22;
            if (uVar22 == 0) {
              auVar30._4_4_ = auVar30._8_4_;
              auVar30._0_4_ = auVar30._8_4_;
              auVar30._12_4_ = auVar30._8_4_;
              auVar76._8_4_ = uVar7;
              auVar76._0_8_ = uVar9;
              auVar76._12_4_ = 0;
              auVar66 = blendvps(auVar76,auVar48,auVar30);
              auVar52 = blendvps(auVar48,auVar68,auVar30);
              auVar31._8_4_ = -(uint)(auVar66._8_4_ < iVar8);
              auVar31._4_4_ = auVar31._8_4_;
              auVar31._0_4_ = auVar31._8_4_;
              auVar31._12_4_ = auVar31._8_4_;
              auVar69._8_4_ = iVar8;
              auVar69._0_8_ = uVar10;
              auVar69._12_4_ = 0;
              auVar79 = blendvps(auVar69,auVar66,auVar31);
              auVar77 = blendvps(auVar66,auVar56,auVar31);
              auVar32._8_4_ = -(uint)(auVar52._8_4_ < auVar77._8_4_);
              auVar32._4_4_ = auVar32._8_4_;
              auVar32._0_4_ = auVar32._8_4_;
              auVar32._12_4_ = auVar32._8_4_;
              auVar66 = blendvps(auVar77,auVar52,auVar32);
              auVar52 = blendvps(auVar52,auVar77,auVar32);
              *pauVar20 = auVar52;
              pauVar20[1] = auVar66;
              uVar24 = auVar79._0_8_;
              pauVar20 = pauVar20 + 2;
            }
            else {
              lVar11 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                }
              }
              auVar33._4_4_ = auVar30._8_4_;
              auVar33._0_4_ = auVar30._8_4_;
              auVar33._8_4_ = auVar30._8_4_;
              auVar33._12_4_ = auVar30._8_4_;
              auVar77 = blendvps(auVar68,auVar48,auVar33);
              auVar52 = blendvps(auVar48,auVar68,auVar33);
              auVar81._8_4_ = *(int *)(local_10c8 + lVar11 * 4);
              auVar81._0_8_ = *(undefined8 *)(uVar21 + lVar11 * 8);
              auVar81._12_4_ = 0;
              auVar34._8_4_ = -(uint)(iVar8 < *(int *)(local_10c8 + lVar11 * 4));
              auVar34._4_4_ = auVar34._8_4_;
              auVar34._0_4_ = auVar34._8_4_;
              auVar34._12_4_ = auVar34._8_4_;
              auVar79 = blendvps(auVar81,auVar56,auVar34);
              auVar66 = blendvps(auVar56,auVar81,auVar34);
              auVar35._8_4_ = -(uint)(auVar52._8_4_ < auVar66._8_4_);
              auVar35._4_4_ = auVar35._8_4_;
              auVar35._0_4_ = auVar35._8_4_;
              auVar35._12_4_ = auVar35._8_4_;
              auVar82 = blendvps(auVar66,auVar52,auVar35);
              auVar52 = blendvps(auVar52,auVar66,auVar35);
              auVar36._8_4_ = -(uint)(auVar77._8_4_ < auVar79._8_4_);
              auVar36._4_4_ = auVar36._8_4_;
              auVar36._0_4_ = auVar36._8_4_;
              auVar36._12_4_ = auVar36._8_4_;
              auVar66 = blendvps(auVar79,auVar77,auVar36);
              auVar77 = blendvps(auVar77,auVar79,auVar36);
              auVar37._8_4_ = -(uint)(auVar77._8_4_ < auVar82._8_4_);
              auVar37._4_4_ = auVar37._8_4_;
              auVar37._0_4_ = auVar37._8_4_;
              auVar37._12_4_ = auVar37._8_4_;
              auVar79 = blendvps(auVar82,auVar77,auVar37);
              auVar77 = blendvps(auVar77,auVar82,auVar37);
              *pauVar20 = auVar52;
              pauVar20[1] = auVar77;
              pauVar20[2] = auVar79;
              uVar24 = auVar66._0_8_;
              pauVar20 = pauVar20 + 3;
            }
          }
        }
      }
      (**(code **)((long)local_1090->leafIntersector +
                  (ulong)*(byte *)(uVar24 & 0xfffffffffffffff0) * 0x40 + 0x10))
                (local_1088,ray,k,context);
      iVar41 = *(int *)(local_1080 + k * 4 + 0x80);
      ray = local_1080;
      iVar42 = iVar41;
      iVar43 = iVar41;
      iVar44 = iVar41;
      fVar91 = local_1048;
      fVar96 = fStack_1044;
      fVar71 = fStack_1040;
      fVar39 = fStack_103c;
      fVar70 = local_1058;
      fVar97 = fStack_1054;
      fVar72 = fStack_1050;
      fVar40 = fStack_104c;
      fVar38 = local_1068;
      fVar49 = fStack_1064;
      fVar50 = fStack_1060;
      fVar57 = fStack_105c;
      fVar88 = local_1038;
      fVar58 = fStack_1034;
      fVar59 = fStack_1030;
      fVar60 = fStack_102c;
      fVar89 = local_10b8;
      fVar61 = fStack_10b4;
      fVar62 = fStack_10b0;
      fVar83 = fStack_10ac;
      fVar90 = local_10a8;
      fVar84 = fStack_10a4;
      fVar85 = fStack_10a0;
      fVar86 = fStack_109c;
      iVar99 = local_1078;
      iVar101 = iStack_1074;
      iVar103 = iStack_1070;
      iVar105 = iStack_106c;
    }
LAB_00286a06:
    if (pauVar20 == (undefined1 (*) [16])&local_f78) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }